

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool ftxui::IsControl(uint32_t ucs)

{
  if (ucs == 0) {
    return true;
  }
  if (ucs < 0x20) {
    return ucs != 10;
  }
  return ucs - 0x7f < 0x21;
}

Assistant:

bool IsControl(uint32_t ucs) {
  if (ucs == 0) {
    return true;
  }
  if (ucs < 32) {  // NOLINT
    const uint32_t LINE_FEED = 10;
    return ucs != LINE_FEED;
  }
  if (ucs >= 0x7f && ucs < 0xa0) {  // NOLINT
    return true;
  }
  return false;
}